

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O0

void __thiscall QPixmap::QPixmap(QPixmap *this,char **xpm)

{
  bool bVar1;
  PixelType PVar2;
  QPlatformPixmap *this_00;
  QImage *in_RSI;
  QImage *in_RDI;
  long in_FS_OFFSET;
  QImage image;
  QImage *this_01;
  QPixmap *in_stack_ffffffffffffffa0;
  QFlagsStorage<Qt::ImageConversionFlag> in_stack_ffffffffffffffcc;
  undefined1 local_20 [16];
  QImageData *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  QPaintDevice::QPaintDevice(&in_RDI->super_QPaintDevice);
  (in_RDI->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&PTR__QPixmap_00e14ce8;
  QExplicitlySharedDataPointer<QPlatformPixmap>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QPlatformPixmap> *)0x320b89);
  doInit(in_stack_ffffffffffffffa0,(int)((ulong)this_01 >> 0x20),(int)this_01,
         (int)((ulong)in_RSI >> 0x20));
  if (in_RSI == (QImage *)0x0) goto LAB_00320c93;
  local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage(this_01,(char **)in_RSI);
  bVar1 = QImage::isNull((QImage *)local_20);
  if (!bVar1) {
    bVar1 = ::QExplicitlySharedDataPointer::operator_cast_to_bool
                      ((QExplicitlySharedDataPointer<QPlatformPixmap> *)0x320bf7);
    if (bVar1) {
      this_00 = QExplicitlySharedDataPointer<QPlatformPixmap>::operator->
                          ((QExplicitlySharedDataPointer<QPlatformPixmap> *)0x320c0a);
      PVar2 = QPlatformPixmap::pixelType(this_00);
      if (PVar2 == BitmapType) {
        QFlags<Qt::ImageConversionFlag>::QFlags
                  ((QFlags<Qt::ImageConversionFlag> *)in_RSI,
                   (ImageConversionFlag)((ulong)in_RDI >> 0x20));
        QBitmap::fromImage(this_01,(ImageConversionFlags)in_stack_ffffffffffffffcc.i);
        operator=((QPixmap *)this_01,(QPixmap *)in_RSI);
        QBitmap::~QBitmap((QBitmap *)0x320c4e);
        goto LAB_00320c89;
      }
    }
    QFlags<Qt::ImageConversionFlag>::QFlags
              ((QFlags<Qt::ImageConversionFlag> *)in_RSI,
               (ImageConversionFlag)((ulong)in_RDI >> 0x20));
    fromImage(in_RDI,(QFlagsStorageHelper<Qt::ImageConversionFlag,_4>)
                     SUB84((ulong)this_01 >> 0x20,0));
    operator=((QPixmap *)this_01,(QPixmap *)in_RSI);
    ~QPixmap((QPixmap *)in_RSI);
  }
LAB_00320c89:
  QImage::~QImage(in_RSI);
LAB_00320c93:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QPixmap::QPixmap(const char * const xpm[])
    : QPaintDevice()
{
    doInit(0, 0, QPlatformPixmap::PixmapType);
    if (!xpm)
        return;

    QImage image(xpm);
    if (!image.isNull()) {
        if (data && data->pixelType() == QPlatformPixmap::BitmapType)
            *this = QBitmap::fromImage(std::move(image));
        else
            *this = fromImage(std::move(image));
    }
}